

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_function_definition(FILE *out,Denoted_Function *function)

{
  char *__ptr;
  
  print_token(out,function->id);
  fwrite(" is",3,1,(FILE *)out);
  if (function->linkage == LINKAGE_EXTERNAL) {
    __ptr = " an externally linked ";
  }
  else {
    if (function->linkage != LINKAGE_INTERNAL) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                    ,0x2cc,"void print_function_definition(FILE *, struct Denoted_Function *)");
    }
    __ptr = " an internally linked ";
  }
  fwrite(__ptr,0x16,1,(FILE *)out);
  print_type(out,function->type,'\x01');
  print_ast(out,(AST *)function->body);
  return;
}

Assistant:

void print_function_definition(FILE *out,struct Denoted_Function *function)
{
	print_token(out,function->id);
	fprintf(out," is");
	switch(function->linkage)
	{
		case LINKAGE_EXTERNAL:
			fprintf(out," an externally linked ");
			break;
		case LINKAGE_INTERNAL:
			fprintf(out," an internally linked ");
			break;
		default:
			assert(0);
	}
	print_type(out,function->type,1);
	print_ast(out,(struct AST*)function->body);
}